

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall
adios2sys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,int *variable,string *value)

{
  char *__nptr;
  long lVar1;
  undefined4 *in_RSI;
  char *res;
  char *local_20 [2];
  undefined4 *local_10;
  
  local_20[0] = (char *)0x0;
  local_10 = in_RSI;
  __nptr = (char *)std::__cxx11::string::c_str();
  lVar1 = strtol(__nptr,local_20,10);
  *local_10 = (int)lVar1;
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(int* variable,
                                            const std::string& value)
{
  char* res = nullptr;
  *variable = static_cast<int>(strtol(value.c_str(), &res, 10));
  // if ( res && *res )
  //  {
  //  Can handle non-int
  //  }
}